

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

BVStatic<256UL> * __thiscall
Memory::HeapBlockMap64::GetMarkBitVectorForPages<256ul>(HeapBlockMap64 *this,void *address)

{
  L2MapChunk *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BVStatic<256UL> *pBVar4;
  Node *pNVar5;
  
  for (pNVar5 = this->list; pNVar5 != (Node *)0x0; pNVar5 = pNVar5->next) {
    if (pNVar5->nodeIndex == (uint)((ulong)address >> 0x20)) goto LAB_006c206f;
  }
  pNVar5 = (Node *)0x0;
LAB_006c206f:
  if (pNVar5 == (Node *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x52e,"(node != nullptr)","node != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  this_00 = (pNVar5->map).map[(ulong)address >> 0x14 & 0xfff];
  if (this_00 != (L2MapChunk *)0x0) {
    pBVar4 = BVStatic<65536ul>::GetRange<256ul>
                       ((BVStatic<65536ul> *)this_00,(uint)address >> 4 & 0xff00);
    return pBVar4;
  }
  return (BVStatic<256UL> *)0x0;
}

Assistant:

BVStatic<BitCount>* HeapBlockMap64::GetMarkBitVectorForPages(void * address)
{
    Node * node = FindNode(address);
    Assert(node != nullptr);
    return node->map.GetMarkBitVectorForPages<BitCount>(address);
}